

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetRuntimeMemoryLimit(JsRuntimeHandle runtimeHandle,size_t *memoryLimit)

{
  JsrtRuntime *this;
  ThreadContext *this_00;
  AllocationPolicyManager *this_01;
  size_t sVar1;
  AllocationPolicyManager *allocPolicyManager;
  ThreadContext *threadContext;
  size_t *memoryLimit_local;
  JsRuntimeHandle runtimeHandle_local;
  
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    runtimeHandle_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (memoryLimit == (size_t *)0x0) {
    runtimeHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *memoryLimit = 0;
    this = JsrtRuntime::FromHandle(runtimeHandle);
    this_00 = JsrtRuntime::GetThreadContext(this);
    this_01 = ThreadContext::GetAllocationPolicyManager(this_00);
    sVar1 = AllocationPolicyManager::GetLimit(this_01);
    *memoryLimit = sVar1;
    runtimeHandle_local._4_4_ = JsNoError;
  }
  return runtimeHandle_local._4_4_;
}

Assistant:

CHAKRA_API JsGetRuntimeMemoryLimit(_In_ JsRuntimeHandle runtimeHandle, _Out_ size_t * memoryLimit)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);
    PARAM_NOT_NULL(memoryLimit);
    *memoryLimit = 0;

    ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    AllocationPolicyManager * allocPolicyManager = threadContext->GetAllocationPolicyManager();

    *memoryLimit = allocPolicyManager->GetLimit();

    return JsNoError;
}